

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void jpgd::jpeg_decoder::decode_block_ac_refine
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  byte bVar1;
  short sVar2;
  coeff_buf *pcVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  huff_tables *phVar6;
  bool bVar7;
  long lVar8;
  uint8 uVar9;
  uint8 uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint local_40;
  
  bVar1 = (byte)pD->m_successive_low;
  uVar15 = 1 << (bVar1 & 0x1f);
  uVar14 = -1 << (bVar1 & 0x1f);
  pcVar3 = pD->m_ac_coeffs[component_id];
  if (((pcVar3->block_num_x <= block_x) || (pcVar3->block_num_y <= block_y)) ||
     (0x3f < pD->m_spectral_end)) {
LAB_00152026:
    stop_decoding(pD,JPGD_DECODE_ERROR);
  }
  puVar4 = pcVar3->pData;
  lVar8 = (long)(pcVar3->block_num_x * block_y * pcVar3->block_size) +
          (long)(block_x * pcVar3->block_size);
  uVar16 = pD->m_spectral_start;
  if ((pD->m_eob_run == 0) && ((int)uVar16 <= pD->m_spectral_end)) {
    do {
      if ((7 < (ulong)(uint)pD->m_comp_ac_tab[component_id]) ||
         (phVar6 = pD->m_pHuff_tabs[(uint)pD->m_comp_ac_tab[component_id]],
         phVar6 == (huff_tables *)0x0)) goto LAB_00152026;
      uVar19 = (ulong)(int)phVar6->look_up[pD->m_bit_buf >> 0x18];
      if ((long)uVar19 < 0) {
        iVar13 = -8;
        do {
          uVar11 = -(uint)((pD->m_bit_buf >> (iVar13 + 0x1fU & 0x1f) & 1) != 0) - (int)uVar19;
          if (((int)(iVar13 + 0x1fU) < 0) || (0x1ff < uVar11)) goto LAB_00152026;
          uVar19 = (ulong)phVar6->tree[uVar11];
          iVar13 = iVar13 + -1;
        } while ((int)phVar6->tree[uVar11] < 0);
        uVar11 = -iVar13;
      }
      else {
        if (0xff < (int)phVar6->look_up[pD->m_bit_buf >> 0x18]) {
          __assert_fail("symbol < JPGD_HUFF_CODE_SIZE_MAX_LENGTH",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                        ,0x227,"int jpgd::jpeg_decoder::huff_decode(huff_tables *)");
        }
        uVar11 = (uint)phVar6->code_size[uVar19];
      }
      get_bits_no_markers(pD,uVar11);
      uVar18 = uVar19 >> 4 & 0xfffffff;
      if ((uVar19 & 0xf) == 0) {
        local_40 = 0;
        if ((int)uVar18 == 0xf) goto LAB_00151eac;
        pD->m_eob_run = 1 << ((byte)uVar18 & 0x1f);
        if (0xf < (uint)uVar19) {
          uVar12 = get_bits_no_markers(pD,(int)uVar18);
          pD->m_eob_run = pD->m_eob_run + uVar12;
        }
        bVar7 = false;
        uVar11 = uVar16;
      }
      else {
        if (((uint)uVar19 & 0xf) != 1) goto LAB_00152026;
        iVar13 = pD->m_bits_left;
        uVar12 = pD->m_bit_buf;
        pD->m_bits_left = iVar13 + -1;
        if (iVar13 < 2) {
          uVar11 = uVar12 << ((byte)iVar13 & 0x1f);
          pD->m_bit_buf = uVar11;
          if (pD->m_in_buf_left < 2) {
LAB_00151e4e:
            uVar9 = get_octet(pD);
            uVar10 = get_octet(pD);
            pD->m_bit_buf = pD->m_bit_buf | (uint)CONCAT11(uVar9,uVar10);
          }
          else {
            puVar5 = pD->m_pIn_buf_ofs;
            if ((*puVar5 == 0xff) || (puVar5[1] == 0xff)) goto LAB_00151e4e;
            pD->m_bit_buf = CONCAT11(*puVar5,puVar5[1]) | uVar11;
            pD->m_in_buf_left = pD->m_in_buf_left + -2;
            pD->m_pIn_buf_ofs = puVar5 + 2;
          }
          iVar13 = pD->m_bits_left;
          pD->m_bit_buf = pD->m_bit_buf << (-(char)iVar13 & 0x1fU);
          pD->m_bits_left = iVar13 + 0x10;
          if (iVar13 < -0x10) goto LAB_00152033;
        }
        else {
          pD->m_bit_buf = uVar12 * 2;
        }
        local_40 = uVar14;
        if ((int)uVar12 < 0) {
          local_40 = uVar15;
        }
LAB_00151eac:
        do {
          lVar17 = (long)(int)(&g_ZAG)[uVar16 & 0x3f];
          if (*(short *)(puVar4 + lVar17 * 2 + lVar8) == 0) {
            uVar11 = (int)uVar18 - 1;
            if (0 < (int)uVar18) {
              uVar18 = (ulong)uVar11;
              goto LAB_00151fca;
            }
            bVar7 = false;
            uVar18 = (ulong)uVar11;
          }
          else {
            iVar13 = pD->m_bits_left;
            uVar12 = pD->m_bit_buf;
            pD->m_bits_left = iVar13 + -1;
            if (iVar13 < 2) {
              uVar11 = uVar12 << ((byte)iVar13 & 0x1f);
              pD->m_bit_buf = uVar11;
              if (pD->m_in_buf_left < 2) {
LAB_00151f52:
                uVar9 = get_octet(pD);
                uVar10 = get_octet(pD);
                pD->m_bit_buf = pD->m_bit_buf | (uint)CONCAT11(uVar9,uVar10);
              }
              else {
                puVar5 = pD->m_pIn_buf_ofs;
                if ((*puVar5 == 0xff) || (puVar5[1] == 0xff)) goto LAB_00151f52;
                pD->m_bit_buf = CONCAT11(*puVar5,puVar5[1]) | uVar11;
                pD->m_in_buf_left = pD->m_in_buf_left + -2;
                pD->m_pIn_buf_ofs = puVar5 + 2;
              }
              iVar13 = pD->m_bits_left;
              pD->m_bit_buf = pD->m_bit_buf << (-(char)iVar13 & 0x1fU);
              pD->m_bits_left = iVar13 + 0x10;
              if (iVar13 < -0x10) goto LAB_00152033;
            }
            else {
              pD->m_bit_buf = uVar12 * 2;
            }
            if (((int)uVar12 < 0) &&
               (sVar2 = *(short *)(puVar4 + lVar17 * 2 + lVar8), (uVar15 & (int)sVar2) == 0)) {
              uVar11 = uVar15;
              if (sVar2 < 0) {
                uVar11 = uVar14;
              }
              *(short *)(puVar4 + lVar17 * 2 + lVar8) = (short)uVar11 + sVar2;
            }
LAB_00151fca:
            uVar16 = uVar16 + 1;
            bVar7 = true;
          }
        } while ((bVar7) && ((int)uVar16 <= pD->m_spectral_end));
        bVar7 = true;
        uVar11 = uVar16;
        if ((local_40 != 0) && ((int)uVar16 < 0x40)) {
          *(short *)(puVar4 + (long)(int)(&g_ZAG)[(int)uVar16] * 2 + lVar8) = (short)local_40;
        }
      }
      uVar16 = uVar11;
    } while ((bVar7) && (uVar16 = uVar11 + 1, (int)uVar11 < pD->m_spectral_end));
  }
  if (0 < pD->m_eob_run) {
    if ((int)uVar16 <= pD->m_spectral_end) {
      do {
        lVar17 = (long)(int)(&g_ZAG)[uVar16 & 0x3f];
        if (*(short *)(puVar4 + lVar17 * 2 + lVar8) != 0) {
          iVar13 = pD->m_bits_left;
          uVar12 = pD->m_bit_buf;
          pD->m_bits_left = iVar13 + -1;
          if (iVar13 < 2) {
            uVar11 = uVar12 << ((byte)iVar13 & 0x1f);
            pD->m_bit_buf = uVar11;
            if (pD->m_in_buf_left < 2) {
LAB_00151c14:
              uVar9 = get_octet(pD);
              uVar10 = get_octet(pD);
              pD->m_bit_buf = pD->m_bit_buf | (uint)CONCAT11(uVar9,uVar10);
            }
            else {
              puVar5 = pD->m_pIn_buf_ofs;
              if ((*puVar5 == 0xff) || (puVar5[1] == 0xff)) goto LAB_00151c14;
              pD->m_bit_buf = CONCAT11(*puVar5,puVar5[1]) | uVar11;
              pD->m_in_buf_left = pD->m_in_buf_left + -2;
              pD->m_pIn_buf_ofs = puVar5 + 2;
            }
            iVar13 = pD->m_bits_left;
            pD->m_bit_buf = pD->m_bit_buf << (-(char)iVar13 & 0x1fU);
            pD->m_bits_left = iVar13 + 0x10;
            if (iVar13 < -0x10) {
LAB_00152033:
              __assert_fail("m_bits_left >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                            ,0x203,"uint jpgd::jpeg_decoder::get_bits_no_markers(int)");
            }
          }
          else {
            pD->m_bit_buf = uVar12 * 2;
          }
          if (((int)uVar12 < 0) &&
             (sVar2 = *(short *)(puVar4 + lVar17 * 2 + lVar8), (uVar15 & (int)sVar2) == 0)) {
            uVar11 = uVar15;
            if (sVar2 < 0) {
              uVar11 = uVar14;
            }
            *(short *)(puVar4 + lVar17 * 2 + lVar8) = (short)uVar11 + sVar2;
          }
        }
        bVar7 = (int)uVar16 < pD->m_spectral_end;
        uVar16 = uVar16 + 1;
      } while (bVar7);
    }
    pD->m_eob_run = pD->m_eob_run + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_refine(jpeg_decoder* pD, int component_id, int block_x, int block_y)
	{
		int s, k, r;

		int p1 = 1 << pD->m_successive_low;

		//int m1 = (-1) << pD->m_successive_low;
		int m1 = static_cast<int>((UINT32_MAX << pD->m_successive_low));

		jpgd_block_coeff_t* p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);
		if (pD->m_spectral_end > 63)
			pD->stop_decoding(JPGD_DECODE_ERROR);

		k = pD->m_spectral_start;

		if (pD->m_eob_run == 0)
		{
			for (; k <= pD->m_spectral_end; k++)
			{
				unsigned int idx = pD->m_comp_ac_tab[component_id];
				if (idx >= JPGD_MAX_HUFF_TABLES)
					pD->stop_decoding(JPGD_DECODE_ERROR);

				s = pD->huff_decode(pD->m_pHuff_tabs[idx]);

				r = s >> 4;
				s &= 15;

				if (s)
				{
					if (s != 1)
						pD->stop_decoding(JPGD_DECODE_ERROR);

					if (pD->get_bits_no_markers(1))
						s = p1;
					else
						s = m1;
				}
				else
				{
					if (r != 15)
					{
						pD->m_eob_run = 1 << r;

						if (r)
							pD->m_eob_run += pD->get_bits_no_markers(r);

						break;
					}
				}

				do
				{
					jpgd_block_coeff_t* this_coef = p + g_ZAG[k & 63];

					if (*this_coef != 0)
					{
						if (pD->get_bits_no_markers(1))
						{
							if ((*this_coef & p1) == 0)
							{
								if (*this_coef >= 0)
									*this_coef = static_cast<jpgd_block_coeff_t>(*this_coef + p1);
								else
									*this_coef = static_cast<jpgd_block_coeff_t>(*this_coef + m1);
							}
						}
					}
					else
					{
						if (--r < 0)
							break;
					}

					k++;

				} while (k <= pD->m_spectral_end);

				if ((s) && (k < 64))
				{
					p[g_ZAG[k]] = static_cast<jpgd_block_coeff_t>(s);
				}
			}
		}

		if (pD->m_eob_run > 0)
		{
			for (; k <= pD->m_spectral_end; k++)
			{
				jpgd_block_coeff_t* this_coef = p + g_ZAG[k & 63]; // logical AND to shut up static code analysis

				if (*this_coef != 0)
				{
					if (pD->get_bits_no_markers(1))
					{
						if ((*this_coef & p1) == 0)
						{
							if (*this_coef >= 0)
								*this_coef = static_cast<jpgd_block_coeff_t>(*this_coef + p1);
							else
								*this_coef = static_cast<jpgd_block_coeff_t>(*this_coef + m1);
						}
					}
				}
			}

			pD->m_eob_run--;
		}
	}